

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerConfig.cpp
# Opt level: O1

RayTracerConfig * RayTracerConfig::fromPlyFile(RayTracerConfig *__return_storage_ptr__,string *path)

{
  pointer *ppTVar1;
  pointer *__args;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined8 uVar4;
  pointer pTVar5;
  char cVar6;
  char cVar7;
  undefined2 uVar8;
  int iVar9;
  istream *piVar10;
  void *pvVar11;
  invalid_argument *piVar12;
  long *plVar13;
  long lVar14;
  pointer pRVar15;
  bool bVar16;
  long lVar17;
  iterator __position;
  long lVar18;
  int iVar19;
  Vector VVar20;
  long local_318;
  ifstream file;
  int aiStack_2f8 [122];
  undefined1 local_110 [8];
  Vector v;
  void *pvStack_e8;
  vector<Point,_std::allocator<Point>_> vertices;
  undefined1 auStack_c8 [8];
  vector<RGB,_std::allocator<RGB>_> colors;
  string sss;
  undefined1 uStack_88;
  uint8_t uStack_87;
  undefined2 uStack_86;
  int iStack_84;
  undefined1 local_70 [8];
  string token;
  int vertexCount;
  int faceCount;
  int local_3c;
  int local_38;
  int g;
  int b;
  int v3;
  
  std::ifstream::ifstream(&local_318,(string *)path,_S_in);
  cVar6 = std::__basic_file<char>::is_open();
  if (cVar6 == '\0') {
    piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,"Unable to open file: ",path);
    std::invalid_argument::invalid_argument
              (piVar12,(string *)
                       &colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    __cxa_throw(piVar12,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  (__return_storage_ptr__->super_BaseConfig).antiAliasing = 2;
  (__return_storage_ptr__->super_BaseConfig).maxRecursionLevel = 1;
  (__return_storage_ptr__->super_BaseConfig).ambientCoefficient = 0.1;
  (__return_storage_ptr__->super_BaseConfig).background.r = '\0';
  (__return_storage_ptr__->super_BaseConfig).background.g = '\0';
  (__return_storage_ptr__->super_BaseConfig).background.b = '\0';
  (__return_storage_ptr__->spheres).super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->spheres).super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->spheres).super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70 = (undefined1  [8])&token._M_string_length;
  token._M_dataplus._M_p = (pointer)0x0;
  token._M_string_length._0_1_ = 0;
  std::operator>>((istream *)&local_318,(string *)local_70);
  iVar9 = std::__cxx11::string::compare(local_70);
  if (iVar9 != 0) {
    piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,"Not a .ply file: ",path);
    std::invalid_argument::invalid_argument
              (piVar12,(string *)
                       &colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    __cxa_throw(piVar12,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::operator>>((istream *)&local_318,(string *)local_70);
  iVar9 = std::__cxx11::string::compare(local_70);
  if (iVar9 != 0) {
    piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar12,"Missing \'format\' specifier.");
    __cxa_throw(piVar12,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  cVar6 = std::ios::widen((char)(istream *)&local_318 + (char)*(undefined8 *)(local_318 + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&local_318,(string *)local_70,cVar6);
  bVar16 = false;
  token.field_2._8_4_ = 0;
  token.field_2._12_4_ = 0;
  vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pvStack_e8 = (void *)0x0;
  vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  auStack_c8 = (undefined1  [8])0x0;
  colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  __args = &colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage;
  do {
    piVar10 = std::operator>>((istream *)&local_318,(string *)local_70);
    if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) {
      if (auStack_c8 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_c8,
                        (long)colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)auStack_c8);
      }
      if (pvStack_e8 != (void *)0x0) {
        operator_delete(pvStack_e8,
                        (long)vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pvStack_e8);
      }
      if (local_70 != (undefined1  [8])&token._M_string_length) {
        operator_delete((void *)local_70,
                        CONCAT71(token._M_string_length._1_7_,(undefined1)token._M_string_length) +
                        1);
      }
      std::ifstream::~ifstream(&local_318);
      return __return_storage_ptr__;
    }
    iVar9 = std::__cxx11::string::compare(local_70);
    cVar6 = (char)(istream *)&local_318;
    if (iVar9 == 0) {
      cVar7 = std::ios::widen((char)*(undefined8 *)(local_318 + -0x18) + cVar6);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&local_318,(string *)local_70,cVar7);
    }
    iVar9 = std::__cxx11::string::compare((char *)local_70);
    if (iVar9 == 0) {
      std::operator>>((istream *)&local_318,(string *)local_70);
      std::istream::operator>>((istream *)&local_318,(int *)(token.field_2._M_local_buf + 8));
      iVar9 = std::__cxx11::string::compare((char *)local_70);
      if (iVar9 == 0) {
        std::operator>>((istream *)&local_318,(string *)local_70);
        while (iVar9 = std::__cxx11::string::compare((char *)local_70), iVar9 == 0) {
          std::operator>>((istream *)&local_318,(string *)local_70);
          iVar9 = std::__cxx11::string::compare((char *)local_70);
          if (iVar9 == 0) {
            bVar16 = true;
          }
          cVar7 = std::ios::widen((char)*(undefined8 *)(local_318 + -0x18) + cVar6);
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&local_318,(string *)local_70,cVar7);
          std::operator>>((istream *)&local_318,(string *)local_70);
        }
      }
      std::operator>>((istream *)&local_318,(string *)local_70);
      std::istream::operator>>((istream *)&local_318,(int *)(token.field_2._M_local_buf + 0xc));
      iVar9 = std::__cxx11::string::compare((char *)local_70);
      if (iVar9 != 0) {
        piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_110,"Unknown element \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                      );
        plVar13 = (long *)std::__cxx11::string::append(local_110);
        colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)*plVar13;
        pRVar15 = (pointer)(plVar13 + 2);
        if (colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage == pRVar15) {
          sss.field_2._M_allocated_capacity = plVar13[3];
          sss._M_string_length._0_4_ = (uint)*(long *)pRVar15;
          sss._M_string_length._4_4_ = (undefined4)((ulong)*(long *)pRVar15 >> 0x20);
          colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)&sss._M_string_length;
        }
        else {
          sss._M_string_length._0_4_ = (uint)*(long *)pRVar15;
          sss._M_string_length._4_4_ = (undefined4)((ulong)*(long *)pRVar15 >> 0x20);
        }
        sss._M_dataplus._M_p._0_4_ = (undefined4)plVar13[1];
        sss._M_dataplus._M_p._4_4_ = (undefined4)((ulong)plVar13[1] >> 0x20);
        *plVar13 = (long)pRVar15;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        std::invalid_argument::invalid_argument
                  (piVar12,(string *)
                           &colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        __cxa_throw(piVar12,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      std::operator>>((istream *)&local_318,(string *)local_70);
      while (iVar9 = std::__cxx11::string::compare(local_70), iVar9 == 0) {
        cVar7 = std::ios::widen((char)*(undefined8 *)(local_318 + -0x18) + cVar6);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&local_318,(string *)local_70,cVar7);
        std::operator>>((istream *)&local_318,(string *)local_70);
      }
    }
    iVar9 = std::__cxx11::string::compare(local_70);
    if (iVar9 == 0) {
      if (0 < (int)token.field_2._8_4_) {
        iVar9 = 0;
        do {
          piVar10 = std::istream::_M_extract<float>((float *)&local_318);
          piVar10 = std::istream::_M_extract<float>((float *)piVar10);
          std::istream::_M_extract<float>((float *)piVar10);
          if (vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
              super__Vector_impl_data._M_start ==
              vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<Point,std::allocator<Point>>::_M_realloc_insert<Point_const&>
                      ((vector<Point,std::allocator<Point>> *)&pvStack_e8,
                       (iterator)
                       vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                       super__Vector_impl_data._M_start,(Point *)local_110);
          }
          else {
            (vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
             super__Vector_impl_data._M_start)->z = v.x;
            (vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
             super__Vector_impl_data._M_start)->x = (float)local_110._0_4_;
            (vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
             super__Vector_impl_data._M_start)->y = (float)local_110._4_4_;
            vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_start =
                 vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
          }
          if (bVar16) {
            pvVar11 = (void *)std::istream::operator>>((istream *)&local_318,(int *)__args);
            pvVar11 = (void *)std::istream::operator>>(pvVar11,&local_3c);
            std::istream::operator>>(pvVar11,&local_38);
            iVar19 = g;
            g._0_2_ = CONCAT11((undefined1)local_3c,
                               colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._0_1_);
            g._3_1_ = SUB41(iVar19,3);
            g._0_3_ = CONCAT12((uint8_t)local_38,(undefined2)g);
            if (colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data
                ._M_start ==
                colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data
                ._M_finish) {
              std::vector<RGB,_std::allocator<RGB>_>::_M_realloc_insert<RGB>
                        ((vector<RGB,_std::allocator<RGB>_> *)auStack_c8,
                         (iterator)
                         colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                         super__Vector_impl_data._M_start,(RGB *)&g);
            }
            else {
              (colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
              _M_start)->b = (uint8_t)local_38;
              uVar8 = (undefined2)g;
LAB_0010919a:
              (colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
              _M_start)->r = (char)uVar8;
              (colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
              _M_start)->g = (char)((ushort)uVar8 >> 8);
              colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
              _M_start = colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                         super__Vector_impl_data._M_start + 1;
            }
          }
          else {
            colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage =
                 (pointer)CONCAT53(colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage._3_5_,0x646464);
            if (colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data
                ._M_start !=
                colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data
                ._M_finish) {
              (colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
              _M_start)->b = 'd';
              uVar8 = 0x6464;
              goto LAB_0010919a;
            }
            std::vector<RGB,_std::allocator<RGB>_>::_M_realloc_insert<RGB>
                      ((vector<RGB,_std::allocator<RGB>_> *)auStack_c8,
                       (iterator)
                       colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                       super__Vector_impl_data._M_start,(RGB *)__args);
          }
          colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)&sss._M_string_length;
          sss._M_dataplus._M_p._0_4_ = 0;
          sss._M_dataplus._M_p._4_4_ = 0;
          sss._M_string_length._0_4_ = (uint)sss._M_string_length & 0xffffff00;
          iVar19 = 0xb;
          do {
            std::operator>>((istream *)&local_318,(string *)__args);
            iVar19 = iVar19 + -1;
          } while (iVar19 != 0);
          if (colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage != (pointer)&sss._M_string_length) {
            operator_delete(colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,
                            CONCAT44(sss._M_string_length._4_4_,(uint)sss._M_string_length) + 1);
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 < (int)token.field_2._8_4_);
      }
      if (0 < (int)token.field_2._12_4_) {
        iVar9 = 0;
        do {
          std::istream::operator>>((istream *)&local_318,(int *)local_110);
          if ((float)local_110._0_4_ == 4.2039e-45) {
            pvVar11 = (void *)std::istream::operator>>((istream *)&local_318,&local_3c);
            pvVar11 = (void *)std::istream::operator>>(pvVar11,&local_38);
            std::istream::operator>>(pvVar11,&g);
            if (auStack_c8 ==
                (undefined1  [8])
                colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data
                ._M_start) {
              sss._M_dataplus._M_p._0_4_ =
                   *(undefined4 *)((long)pvStack_e8 + (long)local_3c * 0xc + 8);
              colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage = *(pointer *)((long)pvStack_e8 + (long)local_3c * 0xc);
              uVar4 = *(undefined8 *)((long)pvStack_e8 + (long)local_38 * 0xc);
              sss._M_dataplus._M_p._4_4_ = (undefined4)uVar4;
              sss._M_string_length._0_4_ = (uint)((ulong)uVar4 >> 0x20);
              sss._M_string_length._4_4_ =
                   *(undefined4 *)((long)pvStack_e8 + (long)local_38 * 0xc + 8);
              sss.field_2._M_allocated_capacity = *(size_type *)((long)pvStack_e8 + (long)g * 0xc);
              sss.field_2._8_4_ = *(undefined4 *)((long)pvStack_e8 + (long)g * 0xc + 8);
              sss.field_2._12_2_ = 0xc828;
              sss.field_2._M_local_buf[0xe] = '(';
              sss.field_2._M_local_buf[0xf] = '2';
              uStack_88 = 0x32;
              uStack_87 = 200;
              uStack_86 = 0;
              iStack_84 = (uint)iStack_84._1_3_ << 8;
              __position._M_current =
                   (__return_storage_ptr__->triangles).
                   super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current !=
                  (__return_storage_ptr__->triangles).
                  super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) goto LAB_0010944b;
              std::vector<Triangle,_std::allocator<Triangle>_>::_M_realloc_insert<Triangle>
                        (&__return_storage_ptr__->triangles,__position,(Triangle *)__args);
            }
            else {
              lVar14 = (long)local_3c;
              sss._M_dataplus._M_p._0_4_ = *(undefined4 *)((long)pvStack_e8 + lVar14 * 0xc + 8);
              colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage = *(pointer *)((long)pvStack_e8 + lVar14 * 0xc);
              lVar17 = (long)local_38;
              sss._M_string_length._4_4_ = *(undefined4 *)((long)pvStack_e8 + lVar17 * 0xc + 8);
              uVar4 = *(undefined8 *)((long)pvStack_e8 + lVar17 * 0xc);
              sss._M_dataplus._M_p._4_4_ = (undefined4)uVar4;
              sss._M_string_length._0_4_ = (uint)((ulong)uVar4 >> 0x20);
              lVar18 = (long)g;
              sss.field_2._8_4_ = *(undefined4 *)((long)pvStack_e8 + lVar18 * 0xc + 8);
              sss.field_2._M_allocated_capacity = *(size_type *)((long)pvStack_e8 + lVar18 * 0xc);
              sss.field_2._M_local_buf[0xe] = ((pointer)((long)auStack_c8 + lVar14 * 3))->b;
              sss.field_2._12_1_ = ((pointer)((long)auStack_c8 + lVar14 * 3))->r;
              sss.field_2._13_1_ = ((pointer)((long)auStack_c8 + lVar14 * 3))->g;
              uStack_87 = ((pointer)((long)auStack_c8 + lVar17 * 3))->b;
              uVar2 = ((pointer)((long)auStack_c8 + lVar17 * 3))->r;
              uVar3 = ((pointer)((long)auStack_c8 + lVar17 * 3))->g;
              iStack_84 = CONCAT31(iStack_84._1_3_,((pointer)((long)auStack_c8 + lVar18 * 3))->b);
              uStack_86._0_1_ = ((pointer)((long)auStack_c8 + lVar18 * 3))->r;
              uStack_86._1_1_ = ((pointer)((long)auStack_c8 + lVar18 * 3))->g;
              __position._M_current =
                   (__return_storage_ptr__->triangles).
                   super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              sss.field_2._M_local_buf[0xf] = uVar2;
              uStack_88 = uVar3;
              if (__position._M_current ==
                  (__return_storage_ptr__->triangles).
                  super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<Triangle,_std::allocator<Triangle>_>::_M_realloc_insert<Triangle>
                          (&__return_storage_ptr__->triangles,__position,(Triangle *)__args);
              }
              else {
LAB_0010944b:
                ((__position._M_current)->normal).x = 0.0;
                ((__position._M_current)->normal).y = 0.0;
                *(undefined8 *)&((__position._M_current)->normal).z = 0x3dcccccd00000000;
                *(ulong *)&((__position._M_current)->z).z =
                     CONCAT17(sss.field_2._M_local_buf[0xf],
                              CONCAT16(sss.field_2._M_local_buf[0xe],
                                       CONCAT24(sss.field_2._12_2_,sss.field_2._8_4_)));
                *(ulong *)&((__position._M_current)->colorY).g =
                     CONCAT44(iStack_84,CONCAT22(uStack_86,CONCAT11(uStack_87,uStack_88)));
                ((__position._M_current)->y).y = (float)(uint)sss._M_string_length;
                ((__position._M_current)->y).z = (float)sss._M_string_length._4_4_;
                ((__position._M_current)->z).x = (float)sss.field_2._M_allocated_capacity._0_4_;
                ((__position._M_current)->z).y = (float)sss.field_2._4_4_;
                *(pointer *)&(__position._M_current)->x =
                     colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                *(ulong *)&((__position._M_current)->x).z =
                     CONCAT44(sss._M_dataplus._M_p._4_4_,sss._M_dataplus._M_p._0_4_);
                ppTVar1 = &(__return_storage_ptr__->triangles).
                           super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppTVar1 = *ppTVar1 + 1;
              }
            }
            VVar20 = getNormalVector((__return_storage_ptr__->triangles).
                                     super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl
                                     .super__Vector_impl_data._M_finish + -1);
            pTVar5 = (__return_storage_ptr__->triangles).
                     super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            pTVar5[-1].normal.x = (float)(int)VVar20._0_8_;
            pTVar5[-1].normal.y = (float)(int)((ulong)VVar20._0_8_ >> 0x20);
            pTVar5[-1].normal.z = VVar20.z;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Warning: only triangles are supported",0x25);
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x48);
            std::ostream::put(-0x48);
            std::ostream::flush();
            cVar7 = std::ios::widen((char)*(undefined8 *)(local_318 + -0x18) + cVar6);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&local_318,(string *)local_70,cVar7);
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 < (int)token.field_2._12_4_);
      }
    }
    if (*(int *)((long)aiStack_2f8 + *(long *)(local_318 + -0x18)) != 0) {
      piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar12,"Invalid config file format.");
      __cxa_throw(piVar12,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  } while( true );
}

Assistant:

RayTracerConfig RayTracerConfig::fromPlyFile(std::string const& path)
{
  std::ifstream file(path);
  if (!file.is_open())
    throw std::invalid_argument("Unable to open file: " + path);

  RayTracerConfig config;
  std::string token;
  file >> token;
  if (token != "ply")
    throw std::invalid_argument("Not a .ply file: " + path);
  file >> token;
  if (token != "format")
    throw std::invalid_argument("Missing 'format' specifier.");
  std::getline(file, token);

  int vertexCount = 0;
  int faceCount = 0;

  std::vector<Vector> vertices;
  std::vector<RGB> colors;
  bool isRGB = false;
  while (file >> token)
  {
    if (token == "comment")
      std::getline(file, token);
    if (token == "element")
    {
      file >> token;
      file >> vertexCount;
      if (token == "vertex")
      {
        // assume format x y z, ignore other
        file >> token;
        while (token == "property")
        {
          file >> token;
          if (token == "uchar")
            isRGB = true;

          std::getline(file, token);
          file >> token;
        }
      }
      file >> token;
      file >> faceCount;
      if (token == "face")
      {
        // assume property list uchar int vertex_indices
        file >> token;
        while (token == "property")
        {
          std::getline(file, token);
          file >> token;
        }
      }
      else
        throw std::invalid_argument("Unknown element '" + token
                                    + "', only 'vertex' and 'face' are supported");
    }
    if (token == "end_header")
    {
      for (int i = 0; i < vertexCount; ++i)
      {
        Vector v;
        file >> v.x >> v.y >> v.z;
        vertices.push_back(v);

        if (isRGB)
        {
          int r, g, b;
          file >> r >> g >> b;
          colors.push_back({uint8_t(r), uint8_t(g), uint8_t(b)});
        }
        else
          colors.push_back({100, 100, 100});
        
        // only for sponza
        std::string sss; for(int j=0; j<11; j++) file >> sss;
      }

      for (int i = 0; i < faceCount; ++i)
      {
        int count;
        file >> count;
        if (count != 3) // only triangles supported
        {
          std::cerr << "Warning: only triangles are supported" << std::endl;
          std::getline(file, token);
          continue;
        }
        int v1, v2, v3;
        file >> v1 >> v2 >> v3;
        // RGB color{uint8_t(rand() % 200), uint8_t(rand() % 200), uint8_t(rand() % 200)};
        if (colors.empty())
          config.triangles.emplace_back(Triangle{
              vertices[v1], vertices[v2], vertices[v3], {40, 200, 40}, {50, 50, 200}, {0, 0, 0}});
        else
          config.triangles.emplace_back(Triangle{vertices[v1], vertices[v2], vertices[v3],
                                                 colors[v1], colors[v2], colors[v3]});
        config.triangles[config.triangles.size()-1].normal = getNormalVector(config.triangles[config.triangles.size()-1]);
      }
    }
    // else
    //  throw std::invalid_argument("Unknown token '" + token + "'");
    if (!file.good())
      throw std::invalid_argument("Invalid config file format.");
  }
  return config;
}